

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Skip(ConcatenatingInputStream *this,int count)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *other;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  long local_30;
  int64 final_byte_count;
  int64 target_byte_count;
  ConcatenatingInputStream *pCStack_18;
  int count_local;
  ConcatenatingInputStream *this_local;
  
  target_byte_count._4_4_ = count;
  pCStack_18 = this;
  while( true ) {
    if (this->stream_count_ < 1) {
      return false;
    }
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    final_byte_count = CONCAT44(extraout_var,iVar1) + (long)(int)target_byte_count._4_4_;
    uVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[4])
                      (*this->streams_,(ulong)target_byte_count._4_4_);
    if ((uVar2 & 1) != 0) break;
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    local_30 = CONCAT44(extraout_var_00,iVar1);
    local_69 = 0;
    if (final_byte_count <= local_30) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
                 ,0x182);
      local_69 = 1;
      other = internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (final_byte_count) < (target_byte_count): ");
      internal::LogFinisher::operator=(local_7d,other);
    }
    if ((local_69 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_68);
    }
    target_byte_count._4_4_ = (int)final_byte_count - (int)local_30;
    this->bytes_retired_ = local_30 + this->bytes_retired_;
    this->streams_ = this->streams_ + 1;
    this->stream_count_ = this->stream_count_ + -1;
  }
  return true;
}

Assistant:

bool ConcatenatingInputStream::Skip(int count) {
  while (stream_count_ > 0) {
    // Assume that ByteCount() can be used to find out how much we actually
    // skipped when Skip() fails.
    int64 target_byte_count = streams_[0]->ByteCount() + count;
    if (streams_[0]->Skip(count)) return true;

    // Hit the end of the stream.  Figure out how many more bytes we still have
    // to skip.
    int64 final_byte_count = streams_[0]->ByteCount();
    GOOGLE_DCHECK_LT(final_byte_count, target_byte_count);
    count = target_byte_count - final_byte_count;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += final_byte_count;
    ++streams_;
    --stream_count_;
  }

  return false;
}